

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O3

void mpiabi_comm_split_type_
               (MPIABI_Fint *comm,MPIABI_Fint *split_type,MPIABI_Fint *key,MPIABI_Fint *info,
               MPIABI_Fint *newcomm,MPIABI_Fint *ierror)

{
  mpi_comm_split_type_();
  return;
}

Assistant:

void mpiabi_comm_split_type_(
  const MPIABI_Fint * comm,
  const MPIABI_Fint * split_type,
  const MPIABI_Fint * key,
  const MPIABI_Fint * info,
  MPIABI_Fint * newcomm,
  MPIABI_Fint * ierror
) {
  return mpi_comm_split_type_(
    comm,
    split_type,
    key,
    info,
    newcomm,
    ierror
  );
}